

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  char cVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar56;
  float fVar57;
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar59;
  uint uVar63;
  uint uVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  undefined1 auVar62 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  vfloat4 a;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar66 = aVar6.x;
    fVar71 = aVar6.y;
    fVar73 = aVar6.z;
    aVar76 = aVar6.field_3;
    fVar34 = fVar71 * fVar71;
    fVar35 = fVar73 * fVar73;
    fVar36 = aVar76.w * aVar76.w;
    fVar47 = fVar34 + fVar66 * fVar66 + fVar35;
    auVar60._0_8_ = CONCAT44(fVar34 + fVar34 + fVar36,fVar47);
    auVar60._8_4_ = fVar34 + fVar35 + fVar35;
    auVar60._12_4_ = fVar34 + fVar36 + fVar36;
    auVar50._8_4_ = auVar60._8_4_;
    auVar50._0_8_ = auVar60._0_8_;
    auVar50._12_4_ = auVar60._12_4_;
    auVar60 = rsqrtss(auVar50,auVar60);
    fVar34 = auVar60._0_4_;
    local_818[0] = fVar34 * 1.5 - fVar34 * fVar34 * fVar47 * 0.5 * fVar34;
    fVar34 = fVar66 * local_818[0];
    fVar35 = fVar71 * local_818[0];
    fVar36 = fVar73 * local_818[0];
    fVar82 = -fVar35;
    fVar47 = -fVar36;
    auVar77._8_4_ = 0xffffffff;
    auVar77._0_8_ = 0xffffffffffffffff;
    if (fVar82 * fVar82 + fVar36 * fVar36 + 0.0 <= fVar34 * fVar34 + fVar47 * fVar47 + 0.0) {
      auVar77 = SUB1612((undefined1  [16])0x0,0);
    }
    auVar15._4_4_ = (uint)fVar82 & auVar77._8_4_;
    auVar15._0_4_ = (uint)fVar36 & auVar77._4_4_;
    auVar15._8_4_ = 0;
    auVar78._0_4_ = ~auVar77._0_4_ & (uint)fVar47;
    auVar78._4_4_ = 0;
    auVar78._8_4_ = ~auVar77._8_4_ & (uint)fVar34;
    auVar78 = auVar78 | auVar15 << 0x20;
    fVar82 = auVar78._0_4_;
    fVar72 = auVar78._4_4_;
    fVar75 = auVar78._8_4_;
    fVar47 = fVar72 * fVar72;
    fVar74 = fVar75 * fVar75;
    fVar83 = fVar47 + fVar82 * fVar82 + fVar74;
    auVar88._0_8_ = CONCAT44(fVar47 + fVar47 + 0.0,fVar83);
    auVar88._8_4_ = fVar47 + fVar74 + fVar74;
    auVar88._12_4_ = fVar47 + 0.0 + 0.0;
    auVar86._8_4_ = auVar88._8_4_;
    auVar86._0_8_ = auVar88._0_8_;
    auVar86._12_4_ = auVar88._12_4_;
    auVar60 = rsqrtss(auVar86,auVar88);
    fVar47 = auVar60._0_4_;
    fVar47 = fVar47 * 1.5 - fVar47 * fVar47 * fVar83 * 0.5 * fVar47;
    fVar82 = fVar47 * fVar82;
    fVar72 = fVar47 * fVar72;
    fVar75 = fVar47 * fVar75;
    fVar74 = fVar72 * fVar34 - fVar35 * fVar82;
    fVar83 = fVar75 * fVar35 - fVar36 * fVar72;
    fVar79 = fVar82 * fVar36 - fVar34 * fVar75;
    fVar81 = fVar47 * 0.0 * aVar76.w * local_818[0] - aVar76.w * local_818[0] * fVar47 * 0.0;
    fVar47 = fVar83 * fVar83;
    fVar80 = fVar79 * fVar79;
    fVar81 = fVar81 * fVar81;
    fVar89 = fVar80 + fVar47 + fVar74 * fVar74;
    fVar90 = fVar81 + fVar47 + fVar47;
    fVar80 = fVar80 + fVar47 + fVar80;
    fVar81 = fVar81 + fVar47 + fVar81;
    auVar85._4_4_ = fVar90;
    auVar85._0_4_ = fVar89;
    auVar85._8_4_ = fVar80;
    auVar85._12_4_ = fVar81;
    auVar52._4_4_ = fVar90;
    auVar52._0_4_ = fVar89;
    auVar52._8_4_ = fVar80;
    auVar52._12_4_ = fVar81;
    auVar60 = rsqrtss(auVar85,auVar52);
    fVar47 = auVar60._0_4_;
    fVar47 = fVar47 * 1.5 - fVar47 * fVar47 * fVar89 * 0.5 * fVar47;
    local_7e8._4_4_ = fVar47 * fVar74;
    local_7e8._0_4_ = fVar75;
    local_7e8._8_4_ = local_818[0] * fVar36;
    local_7e8._12_4_ = 0;
    local_808._4_4_ = fVar47 * fVar83;
    local_808._0_4_ = fVar82;
    local_808._8_4_ = local_818[0] * fVar34;
    local_808._12_4_ = 0;
    local_7f8._4_4_ = fVar47 * fVar79;
    local_7f8._0_4_ = fVar72;
    local_7f8._8_4_ = local_818[0] * fVar35;
    local_7f8._12_4_ = 0;
    puVar23 = local_7d0;
    local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar35 = (ray->org).field_0.m128[0];
    fVar36 = (ray->org).field_0.m128[1];
    fVar47 = (ray->org).field_0.m128[2];
    fVar82 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar34 = 0.0;
    if (0.0 <= fVar82) {
      fVar34 = fVar82;
    }
    auVar60 = divps(_DAT_01f7ba10,(undefined1  [16])aVar6);
    fVar82 = (float)(~-(uint)(1e-18 <= ABS(fVar66)) & 0x5d5e0b6b |
                    auVar60._0_4_ & -(uint)(1e-18 <= ABS(fVar66)));
    fVar72 = (float)(~-(uint)(1e-18 <= ABS(fVar71)) & 0x5d5e0b6b |
                    auVar60._4_4_ & -(uint)(1e-18 <= ABS(fVar71)));
    fVar74 = (float)(~-(uint)(1e-18 <= ABS(fVar73)) & 0x5d5e0b6b |
                    auVar60._8_4_ & -(uint)(1e-18 <= ABS(fVar73)));
    fVar75 = fVar82 * 0.99999964;
    fVar83 = fVar72 * 0.99999964;
    fVar79 = fVar74 * 0.99999964;
    fVar82 = fVar82 * 1.0000004;
    fVar72 = fVar72 * 1.0000004;
    fVar74 = fVar74 * 1.0000004;
    uVar25 = (ulong)(fVar75 < 0.0) * 0x10;
    uVar24 = (ulong)(fVar83 < 0.0) << 4 | 0x20;
    uVar22 = (ulong)(fVar79 < 0.0) << 4 | 0x40;
    auVar69._4_4_ = fVar34;
    auVar69._0_4_ = fVar34;
    auVar69._8_4_ = fVar34;
    auVar69._12_4_ = fVar34;
LAB_0018dcff:
    while (puVar23 != &local_7d8) {
      uVar19 = puVar23[-1];
      puVar23 = puVar23 + -1;
      while( true ) {
        if ((uVar19 & 8) != 0) {
          cVar17 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40 + 8))
                             (local_818,ray,context);
          if (cVar17 != '\0') {
            ray->tfar = -INFINITY;
            return;
          }
          goto LAB_0018dcff;
        }
        fVar34 = (ray->dir).field_0.m128[3];
        uVar20 = (uint)uVar19 & 7;
        uVar18 = uVar19 & 0xfffffffffffffff0;
        if (uVar20 == 3) {
          fVar67 = 1.0 - fVar34;
          fVar68 = fVar67 * 0.0;
          fVar80 = fVar66 * *(float *)(uVar18 + 0x20) +
                   fVar71 * *(float *)(uVar18 + 0x50) + fVar73 * *(float *)(uVar18 + 0x80);
          fVar81 = fVar66 * *(float *)(uVar18 + 0x24) +
                   fVar71 * *(float *)(uVar18 + 0x54) + fVar73 * *(float *)(uVar18 + 0x84);
          fVar89 = fVar66 * *(float *)(uVar18 + 0x28) +
                   fVar71 * *(float *)(uVar18 + 0x58) + fVar73 * *(float *)(uVar18 + 0x88);
          fVar90 = fVar66 * *(float *)(uVar18 + 0x2c) +
                   fVar71 * *(float *)(uVar18 + 0x5c) + fVar73 * *(float *)(uVar18 + 0x8c);
          fVar48 = fVar66 * *(float *)(uVar18 + 0x30) +
                   fVar71 * *(float *)(uVar18 + 0x60) + fVar73 * *(float *)(uVar18 + 0x90);
          fVar56 = fVar66 * *(float *)(uVar18 + 0x34) +
                   fVar71 * *(float *)(uVar18 + 100) + fVar73 * *(float *)(uVar18 + 0x94);
          fVar57 = fVar66 * *(float *)(uVar18 + 0x38) +
                   fVar71 * *(float *)(uVar18 + 0x68) + fVar73 * *(float *)(uVar18 + 0x98);
          fVar58 = fVar66 * *(float *)(uVar18 + 0x3c) +
                   fVar71 * *(float *)(uVar18 + 0x6c) + fVar73 * *(float *)(uVar18 + 0x9c);
          fVar103 = fVar66 * *(float *)(uVar18 + 0x40) +
                    fVar71 * *(float *)(uVar18 + 0x70) + fVar73 * *(float *)(uVar18 + 0xa0);
          fVar104 = fVar66 * *(float *)(uVar18 + 0x44) +
                    fVar71 * *(float *)(uVar18 + 0x74) + fVar73 * *(float *)(uVar18 + 0xa4);
          fVar105 = fVar66 * *(float *)(uVar18 + 0x48) +
                    fVar71 * *(float *)(uVar18 + 0x78) + fVar73 * *(float *)(uVar18 + 0xa8);
          fVar106 = fVar66 * *(float *)(uVar18 + 0x4c) +
                    fVar71 * *(float *)(uVar18 + 0x7c) + fVar73 * *(float *)(uVar18 + 0xac);
          uVar59 = (uint)DAT_01f7b6c0;
          uVar63 = DAT_01f7b6c0._4_4_;
          uVar64 = DAT_01f7b6c0._8_4_;
          uVar65 = DAT_01f7b6c0._12_4_;
          uVar20 = -(uint)(1e-18 <= (float)((uint)fVar80 & uVar59));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar81 & uVar63));
          uVar30 = -(uint)(1e-18 <= (float)((uint)fVar89 & uVar64));
          uVar32 = -(uint)(1e-18 <= (float)((uint)fVar90 & uVar65));
          auVar39._0_4_ = (uint)fVar80 & uVar20;
          auVar39._4_4_ = (uint)fVar81 & uVar28;
          auVar39._8_4_ = (uint)fVar89 & uVar30;
          auVar39._12_4_ = (uint)fVar90 & uVar32;
          auVar45._0_8_ = CONCAT44(~uVar28,~uVar20) & 0x219392ef219392ef;
          auVar45._8_4_ = ~uVar30 & 0x219392ef;
          auVar45._12_4_ = ~uVar32 & 0x219392ef;
          auVar45 = auVar45 | auVar39;
          uVar20 = -(uint)(1e-18 <= (float)((uint)fVar48 & uVar59));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar56 & uVar63));
          uVar30 = -(uint)(1e-18 <= (float)((uint)fVar57 & uVar64));
          uVar32 = -(uint)(1e-18 <= (float)((uint)fVar58 & uVar65));
          auVar53._0_4_ = (uint)fVar48 & uVar20;
          auVar53._4_4_ = (uint)fVar56 & uVar28;
          auVar53._8_4_ = (uint)fVar57 & uVar30;
          auVar53._12_4_ = (uint)fVar58 & uVar32;
          auVar40._0_8_ = CONCAT44(~uVar28,~uVar20) & 0x219392ef219392ef;
          auVar40._8_4_ = ~uVar30 & 0x219392ef;
          auVar40._12_4_ = ~uVar32 & 0x219392ef;
          auVar40 = auVar40 | auVar53;
          uVar20 = -(uint)(1e-18 <= (float)((uint)fVar103 & uVar59));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar104 & uVar63));
          uVar30 = -(uint)(1e-18 <= (float)((uint)fVar105 & uVar64));
          uVar32 = -(uint)(1e-18 <= (float)((uint)fVar106 & uVar65));
          auVar54._0_8_ = CONCAT44(~uVar28,~uVar20) & 0x219392ef219392ef;
          auVar54._8_4_ = ~uVar30 & 0x219392ef;
          auVar54._12_4_ = ~uVar32 & 0x219392ef;
          auVar14._4_4_ = (uint)fVar104 & uVar28;
          auVar14._0_4_ = (uint)fVar103 & uVar20;
          auVar14._8_4_ = (uint)fVar105 & uVar30;
          auVar14._12_4_ = (uint)fVar106 & uVar32;
          auVar54 = auVar54 | auVar14;
          auVar60 = rcpps(_DAT_01f7b6c0,auVar45);
          fVar103 = auVar60._0_4_;
          fVar104 = auVar60._4_4_;
          fVar105 = auVar60._8_4_;
          fVar106 = auVar60._12_4_;
          fVar103 = (1.0 - auVar45._0_4_ * fVar103) * fVar103 + fVar103;
          fVar104 = (1.0 - auVar45._4_4_ * fVar104) * fVar104 + fVar104;
          fVar105 = (1.0 - auVar45._8_4_ * fVar105) * fVar105 + fVar105;
          fVar106 = (1.0 - auVar45._12_4_ * fVar106) * fVar106 + fVar106;
          auVar60 = rcpps(auVar60,auVar40);
          fVar48 = auVar60._0_4_;
          fVar56 = auVar60._4_4_;
          fVar57 = auVar60._8_4_;
          fVar58 = auVar60._12_4_;
          fVar48 = (1.0 - auVar40._0_4_ * fVar48) * fVar48 + fVar48;
          fVar56 = (1.0 - auVar40._4_4_ * fVar56) * fVar56 + fVar56;
          fVar57 = (1.0 - auVar40._8_4_ * fVar57) * fVar57 + fVar57;
          fVar58 = (1.0 - auVar40._12_4_ * fVar58) * fVar58 + fVar58;
          auVar60 = rcpps(auVar60,auVar54);
          fVar80 = auVar60._0_4_;
          fVar81 = auVar60._4_4_;
          fVar89 = auVar60._8_4_;
          fVar90 = auVar60._12_4_;
          fVar80 = (1.0 - auVar54._0_4_ * fVar80) * fVar80 + fVar80;
          fVar81 = (1.0 - auVar54._4_4_ * fVar81) * fVar81 + fVar81;
          fVar89 = (1.0 - auVar54._8_4_ * fVar89) * fVar89 + fVar89;
          fVar90 = (1.0 - auVar54._12_4_ * fVar90) * fVar90 + fVar90;
          auVar16._4_4_ = fVar5;
          auVar16._0_4_ = fVar5;
          auVar16._8_4_ = fVar5;
          auVar16._12_4_ = fVar5;
          fVar91 = *(float *)(uVar18 + 0x20) * fVar35 +
                   *(float *)(uVar18 + 0x50) * fVar36 +
                   *(float *)(uVar18 + 0x80) * fVar47 + *(float *)(uVar18 + 0xb0);
          fVar92 = *(float *)(uVar18 + 0x24) * fVar35 +
                   *(float *)(uVar18 + 0x54) * fVar36 +
                   *(float *)(uVar18 + 0x84) * fVar47 + *(float *)(uVar18 + 0xb4);
          fVar93 = *(float *)(uVar18 + 0x28) * fVar35 +
                   *(float *)(uVar18 + 0x58) * fVar36 +
                   *(float *)(uVar18 + 0x88) * fVar47 + *(float *)(uVar18 + 0xb8);
          fVar94 = *(float *)(uVar18 + 0x2c) * fVar35 +
                   *(float *)(uVar18 + 0x5c) * fVar36 +
                   *(float *)(uVar18 + 0x8c) * fVar47 + *(float *)(uVar18 + 0xbc);
          fVar95 = *(float *)(uVar18 + 0x30) * fVar35 +
                   *(float *)(uVar18 + 0x60) * fVar36 +
                   *(float *)(uVar18 + 0x90) * fVar47 + *(float *)(uVar18 + 0xc0);
          fVar96 = *(float *)(uVar18 + 0x34) * fVar35 +
                   *(float *)(uVar18 + 100) * fVar36 +
                   *(float *)(uVar18 + 0x94) * fVar47 + *(float *)(uVar18 + 0xc4);
          fVar97 = *(float *)(uVar18 + 0x38) * fVar35 +
                   *(float *)(uVar18 + 0x68) * fVar36 +
                   *(float *)(uVar18 + 0x98) * fVar47 + *(float *)(uVar18 + 200);
          fVar98 = *(float *)(uVar18 + 0x3c) * fVar35 +
                   *(float *)(uVar18 + 0x6c) * fVar36 +
                   *(float *)(uVar18 + 0x9c) * fVar47 + *(float *)(uVar18 + 0xcc);
          fVar99 = *(float *)(uVar18 + 0x40) * fVar35 +
                   *(float *)(uVar18 + 0x70) * fVar36 +
                   *(float *)(uVar18 + 0xa0) * fVar47 + *(float *)(uVar18 + 0xd0);
          fVar100 = *(float *)(uVar18 + 0x44) * fVar35 +
                    *(float *)(uVar18 + 0x74) * fVar36 +
                    *(float *)(uVar18 + 0xa4) * fVar47 + *(float *)(uVar18 + 0xd4);
          fVar101 = *(float *)(uVar18 + 0x48) * fVar35 +
                    *(float *)(uVar18 + 0x78) * fVar36 +
                    *(float *)(uVar18 + 0xa8) * fVar47 + *(float *)(uVar18 + 0xd8);
          fVar102 = *(float *)(uVar18 + 0x4c) * fVar35 +
                    *(float *)(uVar18 + 0x7c) * fVar36 +
                    *(float *)(uVar18 + 0xac) * fVar47 + *(float *)(uVar18 + 0xdc);
          auVar84._0_8_ =
               CONCAT44(((*(float *)(uVar18 + 0xe4) * fVar34 + fVar68) - fVar92) * fVar104,
                        ((*(float *)(uVar18 + 0xe0) * fVar34 + fVar68) - fVar91) * fVar103);
          auVar84._8_4_ = ((*(float *)(uVar18 + 0xe8) * fVar34 + fVar68) - fVar93) * fVar105;
          auVar84._12_4_ = ((*(float *)(uVar18 + 0xec) * fVar34 + fVar68) - fVar94) * fVar106;
          auVar62._4_4_ = ((*(float *)(uVar18 + 0x114) * fVar34 + fVar67) - fVar92) * fVar104;
          auVar62._0_4_ = ((*(float *)(uVar18 + 0x110) * fVar34 + fVar67) - fVar91) * fVar103;
          auVar62._8_4_ = ((*(float *)(uVar18 + 0x118) * fVar34 + fVar67) - fVar93) * fVar105;
          auVar62._12_4_ = ((*(float *)(uVar18 + 0x11c) * fVar34 + fVar67) - fVar94) * fVar106;
          auVar87._0_8_ =
               CONCAT44(((*(float *)(uVar18 + 0xf4) * fVar34 + fVar68) - fVar96) * fVar56,
                        ((*(float *)(uVar18 + 0xf0) * fVar34 + fVar68) - fVar95) * fVar48);
          auVar87._8_4_ = ((*(float *)(uVar18 + 0xf8) * fVar34 + fVar68) - fVar97) * fVar57;
          auVar87._12_4_ = ((*(float *)(uVar18 + 0xfc) * fVar34 + fVar68) - fVar98) * fVar58;
          auVar70._0_8_ =
               CONCAT44(((fVar68 + *(float *)(uVar18 + 0x104) * fVar34) - fVar100) * fVar81,
                        ((fVar68 + *(float *)(uVar18 + 0x100) * fVar34) - fVar99) * fVar80);
          auVar70._8_4_ = ((fVar68 + *(float *)(uVar18 + 0x108) * fVar34) - fVar101) * fVar89;
          auVar70._12_4_ = ((fVar68 + *(float *)(uVar18 + 0x10c) * fVar34) - fVar102) * fVar90;
          fVar48 = ((*(float *)(uVar18 + 0x120) * fVar34 + fVar67) - fVar95) * fVar48;
          fVar56 = ((*(float *)(uVar18 + 0x124) * fVar34 + fVar67) - fVar96) * fVar56;
          fVar57 = ((*(float *)(uVar18 + 0x128) * fVar34 + fVar67) - fVar97) * fVar57;
          fVar58 = ((*(float *)(uVar18 + 300) * fVar34 + fVar67) - fVar98) * fVar58;
          auVar33._0_4_ = ((fVar34 * *(float *)(uVar18 + 0x130) + fVar67) - fVar99) * fVar80;
          auVar33._4_4_ = ((fVar34 * *(float *)(uVar18 + 0x134) + fVar67) - fVar100) * fVar81;
          auVar33._8_4_ = ((fVar34 * *(float *)(uVar18 + 0x138) + fVar67) - fVar101) * fVar89;
          auVar33._12_4_ = ((fVar34 * *(float *)(uVar18 + 0x13c) + fVar67) - fVar102) * fVar90;
          auVar46._8_4_ = auVar87._8_4_;
          auVar46._0_8_ = auVar87._0_8_;
          auVar46._12_4_ = auVar87._12_4_;
          auVar12._4_4_ = fVar56;
          auVar12._0_4_ = fVar48;
          auVar12._8_4_ = fVar57;
          auVar12._12_4_ = fVar58;
          auVar50 = minps(auVar46,auVar12);
          auVar41._8_4_ = auVar70._8_4_;
          auVar41._0_8_ = auVar70._0_8_;
          auVar41._12_4_ = auVar70._12_4_;
          auVar60 = minps(auVar41,auVar33);
          auVar50 = maxps(auVar50,auVar60);
          auVar55._8_4_ = auVar84._8_4_;
          auVar55._0_8_ = auVar84._0_8_;
          auVar55._12_4_ = auVar84._12_4_;
          auVar60 = minps(auVar55,auVar62);
          auVar85 = maxps(auVar84,auVar62);
          auVar13._4_4_ = fVar56;
          auVar13._0_4_ = fVar48;
          auVar13._8_4_ = fVar57;
          auVar13._12_4_ = fVar58;
          auVar88 = maxps(auVar87,auVar13);
          auVar52 = maxps(auVar70,auVar33);
          auVar52 = minps(auVar88,auVar52);
          auVar60 = maxps(auVar69,auVar60);
          auVar50 = maxps(auVar60,auVar50);
          auVar60 = minps(auVar16,auVar85);
          auVar60 = minps(auVar60,auVar52);
          iVar26 = -(uint)(auVar50._0_4_ * 0.99999964 <= auVar60._0_4_ * 1.0000004);
          iVar27 = -(uint)(auVar50._4_4_ * 0.99999964 <= auVar60._4_4_ * 1.0000004);
          iVar29 = -(uint)(auVar50._8_4_ * 0.99999964 <= auVar60._8_4_ * 1.0000004);
          iVar31 = -(uint)(auVar50._12_4_ * 0.99999964 <= auVar60._12_4_ * 1.0000004);
        }
        else {
          pfVar3 = (float *)(uVar18 + 0x80 + uVar25);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar25);
          pfVar4 = (float *)(uVar18 + 0x80 + uVar24);
          pfVar2 = (float *)(uVar18 + 0x20 + uVar24);
          auVar42._0_4_ = ((*pfVar3 * fVar34 + *pfVar1) - fVar35) * fVar75;
          auVar42._4_4_ = ((pfVar3[1] * fVar34 + pfVar1[1]) - fVar35) * fVar75;
          auVar42._8_4_ = ((pfVar3[2] * fVar34 + pfVar1[2]) - fVar35) * fVar75;
          auVar42._12_4_ = ((pfVar3[3] * fVar34 + pfVar1[3]) - fVar35) * fVar75;
          auVar49._0_4_ = ((*pfVar4 * fVar34 + *pfVar2) - fVar36) * fVar83;
          auVar49._4_4_ = ((pfVar4[1] * fVar34 + pfVar2[1]) - fVar36) * fVar83;
          auVar49._8_4_ = ((pfVar4[2] * fVar34 + pfVar2[2]) - fVar36) * fVar83;
          auVar49._12_4_ = ((pfVar4[3] * fVar34 + pfVar2[3]) - fVar36) * fVar83;
          pfVar2 = (float *)(uVar18 + 0x80 + uVar22);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar22);
          auVar37._0_4_ = ((*pfVar2 * fVar34 + *pfVar1) - fVar47) * fVar79;
          auVar37._4_4_ = ((pfVar2[1] * fVar34 + pfVar1[1]) - fVar47) * fVar79;
          auVar37._8_4_ = ((pfVar2[2] * fVar34 + pfVar1[2]) - fVar47) * fVar79;
          auVar37._12_4_ = ((pfVar2[3] * fVar34 + pfVar1[3]) - fVar47) * fVar79;
          auVar50 = maxps(auVar49,auVar37);
          auVar60 = maxps(auVar69,auVar42);
          pfVar2 = (float *)(uVar18 + 0x80 + (uVar25 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar25 ^ 0x10));
          auVar60 = maxps(auVar60,auVar50);
          auVar61._0_4_ = ((*pfVar2 * fVar34 + *pfVar1) - fVar35) * fVar82;
          auVar61._4_4_ = ((pfVar2[1] * fVar34 + pfVar1[1]) - fVar35) * fVar82;
          auVar61._8_4_ = ((pfVar2[2] * fVar34 + pfVar1[2]) - fVar35) * fVar82;
          auVar61._12_4_ = ((pfVar2[3] * fVar34 + pfVar1[3]) - fVar35) * fVar82;
          pfVar3 = (float *)(uVar18 + 0x80 + (uVar24 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar24 ^ 0x10));
          pfVar4 = (float *)(uVar18 + 0x80 + (uVar22 ^ 0x10));
          pfVar2 = (float *)(uVar18 + 0x20 + (uVar22 ^ 0x10));
          auVar51._0_4_ = ((*pfVar3 * fVar34 + *pfVar1) - fVar36) * fVar72;
          auVar51._4_4_ = ((pfVar3[1] * fVar34 + pfVar1[1]) - fVar36) * fVar72;
          auVar51._8_4_ = ((pfVar3[2] * fVar34 + pfVar1[2]) - fVar36) * fVar72;
          auVar51._12_4_ = ((pfVar3[3] * fVar34 + pfVar1[3]) - fVar36) * fVar72;
          auVar43._0_4_ = ((*pfVar4 * fVar34 + *pfVar2) - fVar47) * fVar74;
          auVar43._4_4_ = ((pfVar4[1] * fVar34 + pfVar2[1]) - fVar47) * fVar74;
          auVar43._8_4_ = ((pfVar4[2] * fVar34 + pfVar2[2]) - fVar47) * fVar74;
          auVar43._12_4_ = ((pfVar4[3] * fVar34 + pfVar2[3]) - fVar47) * fVar74;
          auVar52 = minps(auVar51,auVar43);
          auVar44._4_4_ = fVar5;
          auVar44._0_4_ = fVar5;
          auVar44._8_4_ = fVar5;
          auVar44._12_4_ = fVar5;
          auVar50 = minps(auVar44,auVar61);
          auVar50 = minps(auVar50,auVar52);
          bVar8 = auVar60._0_4_ <= auVar50._0_4_;
          iVar26 = -(uint)bVar8;
          bVar9 = auVar60._4_4_ <= auVar50._4_4_;
          iVar27 = -(uint)bVar9;
          bVar10 = auVar60._8_4_ <= auVar50._8_4_;
          iVar29 = -(uint)bVar10;
          bVar11 = auVar60._12_4_ <= auVar50._12_4_;
          iVar31 = -(uint)bVar11;
          if (uVar20 == 6) {
            iVar26 = -(uint)((fVar34 < *(float *)(uVar18 + 0xf0) &&
                             *(float *)(uVar18 + 0xe0) <= fVar34) && bVar8);
            iVar27 = -(uint)((fVar34 < *(float *)(uVar18 + 0xf4) &&
                             *(float *)(uVar18 + 0xe4) <= fVar34) && bVar9);
            iVar29 = -(uint)((fVar34 < *(float *)(uVar18 + 0xf8) &&
                             *(float *)(uVar18 + 0xe8) <= fVar34) && bVar10);
            iVar31 = -(uint)((fVar34 < *(float *)(uVar18 + 0xfc) &&
                             *(float *)(uVar18 + 0xec) <= fVar34) && bVar11);
          }
        }
        auVar38._0_4_ = iVar26 << 0x1f;
        auVar38._4_4_ = iVar27 << 0x1f;
        auVar38._8_4_ = iVar29 << 0x1f;
        auVar38._12_4_ = iVar31 << 0x1f;
        uVar20 = movmskps((uint)uVar19,auVar38);
        if (uVar20 == 0) break;
        uVar20 = uVar20 & 0xff;
        lVar7 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar19 = *(ulong *)(uVar18 + lVar7 * 8);
        uVar20 = uVar20 - 1 & uVar20;
        if (uVar20 != 0) {
          *puVar23 = uVar19;
          puVar23 = puVar23 + 1;
          lVar7 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar18 + lVar7 * 8);
          uVar20 = uVar20 - 1 & uVar20;
          uVar21 = (ulong)uVar20;
          if (uVar20 != 0) {
            do {
              *puVar23 = uVar19;
              puVar23 = puVar23 + 1;
              lVar7 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              uVar19 = *(ulong *)(uVar18 + lVar7 * 8);
              uVar21 = uVar21 & uVar21 - 1;
            } while (uVar21 != 0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }